

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_base.h
# Opt level: O2

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_base<double>::set_up_containers
          (Bitmap_cubical_complex_base<double> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sizes,bool is_pos_inf)

{
  size_type __n;
  undefined7 in_register_00000011;
  long lVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  long lVar3;
  pointer puVar4;
  allocator_type local_61;
  uint multiplier;
  undefined4 local_5c;
  Bitmap_cubical_complex_base<double> *local_58;
  value_type_conflict2 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_5c = (undefined4)CONCAT71(in_register_00000011,is_pos_inf);
  multiplier = 1;
  puVar4 = (sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __n = 1;
  lVar3 = 0;
  local_58 = this;
  for (lVar1 = 0;
      lVar1 != (long)(sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
      lVar1 = lVar1 + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->sizes,(value_type_conflict3 *)((long)puVar4 + lVar3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->multipliers,&multiplier);
    puVar4 = (sizes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    multiplier = (*(int *)((long)puVar4 + lVar3) * 2 + 1) * multiplier;
    __n = (size_type)multiplier;
    lVar3 = lVar3 + 4;
  }
  pvVar2 = &local_58->data;
  if ((char)local_5c == '\0') {
    local_50 = -INFINITY;
  }
  else {
    local_50 = INFINITY;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,__n,&local_50,&local_61);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(pvVar2,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void set_up_containers(const std::vector<unsigned>& sizes, bool is_pos_inf) {
    // The fact that multipliers[0]=1 is relied on by optimizations in other functions
    unsigned multiplier = 1;
    for (std::size_t i = 0; i != sizes.size(); ++i) {
      this->sizes.push_back(sizes[i]);
      this->multipliers.push_back(multiplier);
      multiplier *= 2 * sizes[i] + 1;
    }
    if(is_pos_inf)
      this->data = std::vector<T>(multiplier, std::numeric_limits<T>::infinity());
    else
      this->data = std::vector<T>(multiplier, -std::numeric_limits<T>::infinity());
  }